

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void hta::throw_exception<hta::Exception,char_const*,unsigned_long,char_const*>
               (char *args,unsigned_long args_1,char *args_2)

{
  runtime_error *this;
  stringstream msg;
  make_exception<const_char_*,_unsigned_long,_const_char_*> local_1d0 [32];
  stringstream local_1b0 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  detail::make_exception<const_char_*,_unsigned_long,_const_char_*>::operator()
            (local_1d0,(stringstream *)local_1b0,args,args_1,args_2);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,(string *)local_1d0);
  *(undefined ***)this = &PTR__runtime_error_001a9a18;
  __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}